

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
__thiscall duckdb::BatchedDataCollection::FetchCollection(BatchedDataCollection *this)

{
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> _Var1;
  pointer this_00;
  type other;
  _Rb_tree_node_base *p_Var2;
  Allocator *allocator_p;
  ClientContext *this_01;
  long in_RSI;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  result;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  local_50._M_head_impl = (ColumnDataCollection *)0x0;
  p_Var2 = *(_Rb_tree_node_base **)(in_RSI + 0x40);
  if (p_Var2 != (_Rb_tree_node_base *)(in_RSI + 0x30)) {
    do {
      if ((ClientContext *)local_50._M_head_impl == (ClientContext *)0x0) {
        local_50._M_head_impl = (ColumnDataCollection *)p_Var2[1]._M_parent;
        p_Var2[1]._M_parent = (_Base_ptr)0x0;
      }
      else {
        this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                *)&local_50);
        other = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                ::operator*((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                             *)&p_Var2[1]._M_parent);
        ColumnDataCollection::Combine(this_00,other);
      }
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)(in_RSI + 0x30));
  }
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
  ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
           *)(in_RSI + 0x28));
  if ((ClientContext *)local_50._M_head_impl == (ClientContext *)0x0) {
    allocator_p = Allocator::DefaultAllocator();
    this_01 = (ClientContext *)operator_new(0x70);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_48,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(in_RSI + 8));
    ColumnDataCollection::ColumnDataCollection
              ((ColumnDataCollection *)this_01,allocator_p,
               (vector<duckdb::LogicalType,_true> *)&local_48);
    this->context = this_01;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  }
  else {
    this->context = (ClientContext *)local_50._M_head_impl;
    local_50._M_head_impl = (ColumnDataCollection *)0x0;
  }
  _Var1._M_head_impl = local_50._M_head_impl;
  if ((ClientContext *)local_50._M_head_impl != (ClientContext *)0x0) {
    ColumnDataCollection::~ColumnDataCollection(local_50._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  return (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          )(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            )this;
}

Assistant:

unique_ptr<ColumnDataCollection> BatchedDataCollection::FetchCollection() {
	unique_ptr<ColumnDataCollection> result;
	for (auto &entry : data) {
		if (!result) {
			result = std::move(entry.second);
		} else {
			result->Combine(*entry.second);
		}
	}
	data.clear();
	if (!result) {
		// empty result
		return make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator(), types);
	}
	return result;
}